

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall VW::ptr_queue<example>::ptr_queue(ptr_queue<example> *this,size_t max_size)

{
  this->max_size = max_size;
  std::queue<example*,std::deque<example*,std::allocator<example*>>>::
  queue<std::deque<example*,std::allocator<example*>>,void>(&this->object_queue);
  *(undefined8 *)((long)&(this->mut).super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)((long)&(this->mut).super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  *(undefined8 *)((long)&(this->mut).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mut).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mut).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mut).super___mutex_base._M_mutex + 8) = 0;
  std::condition_variable::condition_variable(&this->is_not_full);
  std::condition_variable::condition_variable(&this->is_not_empty);
  return;
}

Assistant:

ptr_queue(size_t max_size)
      : max_size(max_size)
    {}